

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

ExprPtr __thiscall pegmatite::nl(pegmatite *this,ExprPtr *e)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Expr *__p;
  _Atomic_word _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  ExprPtr EVar5;
  
  __p = (Expr *)operator_new(0x18);
  peVar1 = (e->super_shared_ptr<pegmatite::Expr>).
           super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (e->super_shared_ptr<pegmatite::Expr>).
            super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __p[1]._vptr_Expr = (_func_int **)peVar1;
    __p[2]._vptr_Expr = (_func_int **)0x0;
    goto LAB_0012a98c;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') goto LAB_0012a962;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar4 = __libc_single_threaded != '\0';
    __p->_vptr_Expr = (_func_int **)&PTR__UnaryExpr_00157dd8;
    __p[1]._vptr_Expr = (_func_int **)peVar1;
    __p[2]._vptr_Expr = (_func_int **)this_00;
    if (bVar4) {
      _Var2 = this_00->_M_use_count;
      goto LAB_0012a97e;
    }
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
LAB_0012a962:
    _Var2 = this_00->_M_use_count + 1;
    this_00->_M_use_count = _Var2;
    __p->_vptr_Expr = (_func_int **)&PTR__UnaryExpr_00157dd8;
    __p[1]._vptr_Expr = (_func_int **)peVar1;
    __p[2]._vptr_Expr = (_func_int **)this_00;
LAB_0012a97e:
    this_00->_M_use_count = _Var2 + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_0012a98c:
  __p->_vptr_Expr = (_func_int **)&PTR__UnaryExpr_00158130;
  *(Expr **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<pegmatite::Expr*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  _Var3._M_pi = extraout_RDX;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var3._M_pi = extraout_RDX_00;
  }
  EVar5.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  EVar5.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ExprPtr)EVar5.super_shared_ptr<pegmatite::Expr>.
                  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr nl(const ExprPtr &e)
{
	return ExprPtr(new NewlineExpr(e));
}